

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-ft-stroker.c
# Opt level: O2

PVG_FT_Error PVG_FT_Stroker_ParseOutline(PVG_FT_Stroker stroker,PVG_FT_Outline *outline)

{
  PVG_FT_Vector *pPVar1;
  char *pcVar2;
  PVG_FT_Pos *pPVar3;
  PVG_FT_Vector *pPVar4;
  PVG_FT_Vector *pPVar5;
  PVG_FT_Vector *pPVar6;
  uint uVar7;
  uint uVar8;
  byte *pbVar9;
  long lVar10;
  ulong uVar11;
  ulong uVar12;
  PVG_FT_Vector v_control;
  PVG_FT_Vector v_start;
  PVG_FT_Vector vec;
  PVG_FT_Vector local_98;
  PVG_FT_Vector local_88;
  undefined4 uStack_78;
  int iStack_74;
  PVG_FT_Outline *local_70;
  ulong local_68;
  long local_60;
  PVG_FT_Vector vec2;
  PVG_FT_Vector vec_1;
  
  if (stroker == (PVG_FT_Stroker)0x0 || outline == (PVG_FT_Outline *)0x0) {
    return -1;
  }
  stroker->borders[0].num_points = 0;
  stroker->borders[0].start = -1;
  local_60 = 0;
  stroker->borders[0].valid = '\0';
  stroker->borders[1].num_points = 0;
  stroker->borders[1].start = -1;
  stroker->borders[1].valid = '\0';
  uVar8 = 0;
  local_70 = outline;
  do {
    if (outline->n_contours <= local_60) {
      return 0;
    }
    uVar7 = outline->contours[local_60];
    local_68 = (ulong)uVar7;
    if (uVar8 < uVar7) {
      pPVar1 = outline->points;
      pPVar6 = pPVar1 + local_68;
      pPVar4 = pPVar1 + uVar8;
      lVar10 = pPVar1[uVar8].x;
      local_88.y = pPVar1[uVar8].y;
      local_88.x = pPVar6->x;
      pPVar3 = &pPVar6->y;
      local_98.x = pPVar1[uVar8].x;
      local_98.y = pPVar1[uVar8].y;
      pcVar2 = outline->tags;
      pbVar9 = (byte *)(pcVar2 + uVar8);
      if ((pcVar2[uVar8] & 3U) == 0) {
        if ((pcVar2[local_68] & 3U) == 1) {
          pPVar6 = pPVar6 + -1;
          local_88.y = *pPVar3;
        }
        else {
          local_88.x = local_88.x + lVar10;
          lVar10 = *pPVar3 + local_88.y;
          uVar11 = local_88.x - (local_88.x >> 0x3f);
          uVar12 = lVar10 - (lVar10 >> 0x3f);
          iStack_74 = (int)((long)uVar12 >> 0x21);
          uStack_78 = (undefined4)(uVar12 >> 1);
          local_88.x = CONCAT44((int)((long)uVar11 >> 0x21),(int)(uVar11 >> 1));
        }
        pPVar4 = pPVar4 + -1;
        pbVar9 = pbVar9 + -1;
      }
      else {
        local_88.x = lVar10;
        if ((pcVar2[uVar8] & 3U) == 2) {
          return -2;
        }
      }
      PVG_FT_Stroker_BeginSubPath(stroker,&local_88,outline->contours_flag[local_60]);
      while (pPVar4 < pPVar6) {
        if ((pbVar9[1] & 3) == 0) {
          local_98.x = pPVar4[1].x;
          local_98.y = pPVar4[1].y;
          pPVar4 = pPVar4 + 2;
          pbVar9 = pbVar9 + 2;
          while( true ) {
            if (pPVar6 <= pPVar4 + -1) {
              PVG_FT_Stroker_ConicTo(stroker,&local_98,&local_88);
              goto LAB_00119884;
            }
            vec.x = pPVar4->x;
            vec.y = pPVar4->y;
            if ((*pbVar9 & 3) != 0) break;
            uVar11 = (vec.x + local_98.x) - (vec.x + local_98.x >> 0x3f);
            uVar12 = (vec.y + local_98.y) - (vec.y + local_98.y >> 0x3f);
            vec2.x = CONCAT44((int)((long)uVar11 >> 0x21),(int)(uVar11 >> 1));
            vec_1.x = CONCAT44((int)((long)uVar12 >> 0x21),(int)(uVar12 >> 1));
            PVG_FT_Stroker_ConicTo(stroker,&local_98,&vec2);
            local_98.x = vec.x;
            local_98.y = vec.y;
            pPVar4 = pPVar4 + 1;
            pbVar9 = pbVar9 + 1;
          }
          if ((*pbVar9 & 3) != 1) {
            return -2;
          }
          PVG_FT_Stroker_ConicTo(stroker,&local_98,&vec);
        }
        else {
          pPVar1 = pPVar4 + 1;
          if ((pbVar9[1] & 3) == 1) {
            pbVar9 = pbVar9 + 1;
            vec.x = pPVar1->x;
            vec.y = pPVar4[1].y;
            PVG_FT_Stroker_LineTo(stroker,&vec);
            pPVar4 = pPVar1;
          }
          else {
            if (pPVar6 < pPVar4 + 2) {
              return -2;
            }
            if ((pbVar9[2] & 3) != 2) {
              return -2;
            }
            pPVar5 = pPVar4 + 3;
            vec.x = pPVar1->x;
            vec.y = pPVar4[1].y;
            vec2.x = pPVar4[2].x;
            vec2.y = pPVar4[2].y;
            if (pPVar6 < pPVar5) {
              PVG_FT_Stroker_CubicTo(stroker,&vec,&vec2,&local_88);
              break;
            }
            pbVar9 = pbVar9 + 3;
            vec_1.x = pPVar5->x;
            vec_1.y = pPVar4[3].y;
            PVG_FT_Stroker_CubicTo(stroker,&vec,&vec2,&vec_1);
            pPVar4 = pPVar5;
          }
        }
      }
LAB_00119884:
      if (stroker->first_point != '\0') {
        stroker->subpath_open = '\x01';
        ft_stroker_subpath_start(stroker,0,0);
      }
      PVG_FT_Stroker_EndSubPath(stroker);
      uVar7 = (uint)local_68;
      outline = local_70;
    }
    uVar8 = uVar7 + 1;
    local_60 = local_60 + 1;
  } while( true );
}

Assistant:

PVG_FT_Error PVG_FT_Stroker_ParseOutline(PVG_FT_Stroker        stroker,
                                       const PVG_FT_Outline* outline)
{
    PVG_FT_Vector v_last;
    PVG_FT_Vector v_control;
    PVG_FT_Vector v_start;

    PVG_FT_Vector* point;
    PVG_FT_Vector* limit;
    char*         tags;

    PVG_FT_Error error;

    PVG_FT_Int  n;     /* index of contour in outline     */
    PVG_FT_UInt first; /* index of first point in contour */
    PVG_FT_Int  tag;   /* current point's state           */

    if (!outline || !stroker) return -1;  // PVG_FT_THROW( Invalid_Argument );

    PVG_FT_Stroker_Rewind(stroker);

    first = 0;

    for (n = 0; n < outline->n_contours; n++) {
        PVG_FT_UInt last; /* index of last point in contour */

        last = outline->contours[n];
        limit = outline->points + last;

        /* skip empty points; we don't stroke these */
        if (last <= first) {
            first = last + 1;
            continue;
        }

        v_start = outline->points[first];
        v_last = outline->points[last];

        v_control = v_start;

        point = outline->points + first;
        tags = outline->tags + first;
        tag = PVG_FT_CURVE_TAG(tags[0]);

        /* A contour cannot start with a cubic control point! */
        if (tag == PVG_FT_CURVE_TAG_CUBIC) goto Invalid_Outline;

        /* check first point to determine origin */
        if (tag == PVG_FT_CURVE_TAG_CONIC) {
            /* First point is conic control.  Yes, this happens. */
            if (PVG_FT_CURVE_TAG(outline->tags[last]) == PVG_FT_CURVE_TAG_ON) {
                /* start at last point if it is on the curve */
                v_start = v_last;
                limit--;
            } else {
                /* if both first and last points are conic, */
                /* start at their middle                    */
                v_start.x = (v_start.x + v_last.x) / 2;
                v_start.y = (v_start.y + v_last.y) / 2;
            }
            point--;
            tags--;
        }

        error = PVG_FT_Stroker_BeginSubPath(stroker, &v_start, outline->contours_flag[n]);
        if (error) goto Exit;

        while (point < limit) {
            point++;
            tags++;

            tag = PVG_FT_CURVE_TAG(tags[0]);
            switch (tag) {
            case PVG_FT_CURVE_TAG_ON: /* emit a single line_to */
            {
                PVG_FT_Vector vec;

                vec.x = point->x;
                vec.y = point->y;

                error = PVG_FT_Stroker_LineTo(stroker, &vec);
                if (error) goto Exit;
                continue;
            }

            case PVG_FT_CURVE_TAG_CONIC: /* consume conic arcs */
                v_control.x = point->x;
                v_control.y = point->y;

            Do_Conic:
                if (point < limit) {
                    PVG_FT_Vector vec;
                    PVG_FT_Vector v_middle;

                    point++;
                    tags++;
                    tag = PVG_FT_CURVE_TAG(tags[0]);

                    vec = point[0];

                    if (tag == PVG_FT_CURVE_TAG_ON) {
                        error =
                            PVG_FT_Stroker_ConicTo(stroker, &v_control, &vec);
                        if (error) goto Exit;
                        continue;
                    }

                    if (tag != PVG_FT_CURVE_TAG_CONIC) goto Invalid_Outline;

                    v_middle.x = (v_control.x + vec.x) / 2;
                    v_middle.y = (v_control.y + vec.y) / 2;

                    error =
                        PVG_FT_Stroker_ConicTo(stroker, &v_control, &v_middle);
                    if (error) goto Exit;

                    v_control = vec;
                    goto Do_Conic;
                }

                error = PVG_FT_Stroker_ConicTo(stroker, &v_control, &v_start);
                goto Close;

            default: /* PVG_FT_CURVE_TAG_CUBIC */
            {
                PVG_FT_Vector vec1, vec2;

                if (point + 1 > limit ||
                    PVG_FT_CURVE_TAG(tags[1]) != PVG_FT_CURVE_TAG_CUBIC)
                    goto Invalid_Outline;

                point += 2;
                tags += 2;

                vec1 = point[-2];
                vec2 = point[-1];

                if (point <= limit) {
                    PVG_FT_Vector vec;

                    vec = point[0];

                    error = PVG_FT_Stroker_CubicTo(stroker, &vec1, &vec2, &vec);
                    if (error) goto Exit;
                    continue;
                }

                error = PVG_FT_Stroker_CubicTo(stroker, &vec1, &vec2, &v_start);
                goto Close;
            }
            }
        }

    Close:
        if (error) goto Exit;

        if (stroker->first_point) {
            stroker->subpath_open = TRUE;
            error = ft_stroker_subpath_start(stroker, 0, 0);
            if (error) goto Exit;
        }

        error = PVG_FT_Stroker_EndSubPath(stroker);
        if (error) goto Exit;

        first = last + 1;
    }

    return 0;

Exit:
    return error;

Invalid_Outline:
    return -2;  // PVG_FT_THROW( Invalid_Outline );
}